

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O3

bool TdokuMinimize(bool pencilmark,bool monotonic,char *puzzle)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  byte bVar8;
  State *pSVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  pointer piVar13;
  char cVar14;
  long lVar15;
  vector<int,_std::allocator<int>_> permutation;
  State state;
  vector<int,_std::allocator<int>_> local_438;
  State local_420;
  State local_240;
  
  Util::Permutation(&local_438,(Util *)((anonymous_namespace)::generator + 0x220),0x2d9);
  bVar12 = true;
  if (local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    bVar8 = 0;
    piVar13 = local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      iVar3 = *piVar13;
      lVar15 = (long)iVar3;
      if (pencilmark) {
        cVar14 = '.';
        if (puzzle[lVar15] == '.') {
LAB_00105a1f:
          lVar10 = 0;
          pSVar9 = &local_420;
          do {
            lVar11 = 0x10;
            *(undefined8 *)((long)local_420.bands[0][1].configurations.vec + lVar10) = 0;
            *(undefined8 *)((long)local_420.bands[0][1].configurations.vec + lVar10 + 8) = 0;
            *(undefined8 *)((long)local_420.bands[0][1].eliminations.vec + lVar10) = 0;
            *(undefined8 *)((long)local_420.bands[0][1].eliminations.vec + lVar10 + 8) = 0;
            *(undefined8 *)((long)local_420.bands[0][2].configurations.vec + lVar10) = 0;
            *(undefined8 *)((long)local_420.bands[0][2].configurations.vec + lVar10 + 8) = 0;
            *(undefined8 *)((long)local_420.bands[0][2].eliminations.vec + lVar10) = 0;
            *(undefined8 *)((long)local_420.bands[0][2].eliminations.vec + lVar10 + 8) = 0;
            *(undefined8 *)((long)local_420.bands[0][0].configurations.vec + lVar10) = 0;
            *(undefined8 *)((long)local_420.bands[0][0].configurations.vec + lVar10 + 8) = 0;
            *(undefined8 *)((long)local_420.bands[0][0].eliminations.vec + lVar10) = 0;
            *(undefined8 *)((long)local_420.bands[0][0].eliminations.vec + lVar10 + 8) = 0;
            *(undefined8 *)((long)local_420.bands[0][1].configurations.vec + lVar10) = 0;
            *(undefined8 *)((long)local_420.bands[0][1].configurations.vec + lVar10 + 8) = 0;
            *(undefined8 *)((long)local_420.bands[0][1].eliminations.vec + lVar10) = 0;
            *(undefined8 *)((long)local_420.bands[0][1].eliminations.vec + lVar10 + 8) = 0;
            do {
              puVar1 = (undefined8 *)((long)(pSVar9->bands + -1) + 0x50 + lVar11);
              *puVar1 = 0x1ff01ff01ff01ff;
              puVar1[1] = 0x1ff01ff;
              puVar1 = (undefined8 *)((long)pSVar9->bands[0][0].configurations.vec + lVar11);
              *puVar1 = 0;
              puVar1[1] = 0;
              lVar11 = lVar11 + 0x20;
            } while (lVar11 != 0x70);
            lVar10 = lVar10 + 0x60;
            pSVar9 = (State *)(pSVar9->bands + 1);
          } while (lVar10 != 0xc0);
          lVar10 = 0xc0;
          do {
            *(undefined8 *)((long)local_420.bands[0][0].configurations.vec + lVar10) =
                 0x1ff01ff01ff01ff;
            *(undefined8 *)((long)local_420.bands[0][0].configurations.vec + lVar10 + 8) =
                 0x1ff01ff01ff01ff;
            *(undefined8 *)((long)local_420.bands[0][0].eliminations.vec + lVar10) =
                 0x1ff01ff01ff01ff;
            *(undefined8 *)((long)local_420.bands[0][0].eliminations.vec + lVar10 + 8) =
                 0x1ff01ff01ff01ff;
            lVar10 = lVar10 + 0x20;
          } while (lVar10 != 0x1e0);
          if (pencilmark) {
            puzzle[lVar15] =
                 (char)iVar3 +
                 ((char)(uint)((ulong)(lVar15 * 0x38e38e39) >> 0x21) - (char)(iVar3 >> 0x1f)) * -9 +
                 '1';
            anon_unknown.dwarf_8b17::SolverDpllTriadSimd<0>::InitPencilmarkByBox(puzzle,&local_420);
          }
          else {
            puzzle[lVar15] = '.';
            anon_unknown.dwarf_8b17::SolverDpllTriadSimd<0>::InitVanillaByBand(puzzle,&local_420);
          }
          bVar12 = false;
          lVar10 = 0;
          pSVar9 = &local_240;
          do {
            lVar11 = 0x10;
            do {
              puVar2 = (undefined8 *)
                       ((long)local_420.bands[lVar10 + -1][2].eliminations.vec + lVar11);
              uVar4 = puVar2[1];
              puVar1 = (undefined8 *)((long)local_420.bands[lVar10][0].configurations.vec + lVar11);
              uVar5 = *puVar1;
              uVar6 = puVar1[1];
              puVar1 = (undefined8 *)((long)(pSVar9->bands + -1) + 0x50 + lVar11);
              *puVar1 = *puVar2;
              puVar1[1] = uVar4;
              puVar1 = (undefined8 *)((long)pSVar9->bands[0][0].configurations.vec + lVar11);
              *puVar1 = uVar5;
              puVar1[1] = uVar6;
              lVar11 = lVar11 + 0x20;
            } while (lVar11 != 0x70);
            lVar10 = 1;
            bVar7 = !bVar12;
            bVar12 = true;
            pSVar9 = (State *)(local_240.bands + 1);
          } while (bVar7);
          memcpy(local_240.boxen,local_420.boxen,0x120);
          (anonymous_namespace)::generator._480_8_ = 2;
          (anonymous_namespace)::generator._488_8_ = 0;
          anon_unknown.dwarf_8b17::SolverDpllTriadSimd<0>::
          CountSolutionsConsistentWithPartialAssignment
                    ((SolverDpllTriadSimd<0> *)(anonymous_namespace)::generator,&local_240);
          if ((ulong)(anonymous_namespace)::generator._488_8_ < 2) {
            if ((monotonic & bVar8) != 0) {
              bVar12 = false;
              goto LAB_00105bcc;
            }
          }
          else {
            bVar8 = 1;
            puzzle[lVar15] = cVar14;
          }
        }
      }
      else if ((iVar3 < 0x51) && (cVar14 = puzzle[lVar15], cVar14 != '.')) goto LAB_00105a1f;
      piVar13 = piVar13 + 1;
    } while (piVar13 !=
             local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
    bVar12 = true;
  }
LAB_00105bcc:
  if (local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar12;
}

Assistant:

bool TdokuMinimize(bool pencilmark, bool monotonic, char *puzzle) {
    return generator.Minimize(pencilmark, monotonic, puzzle);
}